

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

char * TagToString(Node *tag,char *buf,size_t count)

{
  NodeType NVar1;
  Bool BVar2;
  uint uVar3;
  undefined4 extraout_var;
  char *pcVar4;
  ctmbstr format;
  
  *buf = '\0';
  if (tag == (Node *)0x0) goto LAB_0014ed8c;
  BVar2 = prvTidynodeIsElement(tag);
  if (BVar2 == no) {
    NVar1 = tag->type;
    if ((int)NVar1 < 6) {
      if (NVar1 == DocTypeTag) {
        prvTidytmbsnprintf(buf,count,"<!DOCTYPE>");
        goto LAB_0014ed8c;
      }
      if (NVar1 == TextNode) {
        format = anon_var_dwarf_55150 + 0x16;
        pcVar4 = "STRING_PLAIN_TEXT";
      }
      else {
LAB_0014edd3:
        pcVar4 = tag->element;
        if (pcVar4 == (char *)0x0) goto LAB_0014ed8c;
        format = anon_var_dwarf_55150 + 0x16;
      }
    }
    else if (NVar1 == XmlDecl) {
      format = anon_var_dwarf_55150 + 0x16;
      pcVar4 = "STRING_XML_DECLARATION";
    }
    else {
      if (NVar1 != EndTag) goto LAB_0014edd3;
      pcVar4 = tag->element;
      format = "</%s>";
    }
  }
  else {
    pcVar4 = tag->element;
    format = "<%s>";
  }
  prvTidytmbsnprintf(buf,count,format,pcVar4);
LAB_0014ed8c:
  uVar3 = prvTidytmbstrlen(buf);
  return (char *)CONCAT44(extraout_var,uVar3);
}

Assistant:

static char* TagToString(Node* tag, char* buf, size_t count)
{
    *buf = 0;
    if (tag)
    {
        if (TY_(nodeIsElement)(tag))
            TY_(tmbsnprintf)(buf, count, "<%s>", tag->element);
        else if (tag->type == EndTag)
            TY_(tmbsnprintf)(buf, count, "</%s>", tag->element);
        else if (tag->type == DocTypeTag)
            TY_(tmbsnprintf)(buf, count, "<!DOCTYPE>");
        else if (tag->type == TextNode)
            TY_(tmbsnprintf)(buf, count, "%s", "STRING_PLAIN_TEXT");
        else if (tag->type == XmlDecl)
            TY_(tmbsnprintf)(buf, count, "%s", "STRING_XML_DECLARATION");
        else if (tag->element)
            TY_(tmbsnprintf)(buf, count, "%s", tag->element);
    }
    return buf + TY_(tmbstrlen)(buf);
}